

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar9;
  Fad<double> *pFVar10;
  uint uVar11;
  ulong uVar12;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar13;
  value_type vVar14;
  double dVar15;
  
  pFVar13 = (fadexpr->fadexpr_).left_;
  pFVar9 = (pFVar13->fadexpr_).left_;
  pFVar10 = (pFVar9->fadexpr_).right_;
  uVar11 = (pFVar10->dx_).num_elts;
  uVar2 = (((((pFVar13->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar11) {
    uVar2 = uVar11;
  }
  uVar3 = (this->dx_).num_elts;
  if (uVar2 == uVar3) {
    if (uVar2 == 0) goto LAB_00e11ad4;
    pdVar8 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00e11ad4;
    }
    if (uVar3 != 0) {
      pdVar8 = (this->dx_).ptr_to_data;
      if (pdVar8 != (double *)0x0) {
        operator_delete__(pdVar8);
        pFVar13 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar2;
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      uVar12 = (ulong)uVar2 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar12);
    (this->dx_).ptr_to_data = pdVar8;
    pFVar9 = (pFVar13->fadexpr_).left_;
    pFVar10 = (pFVar9->fadexpr_).right_;
    uVar11 = (pFVar10->dx_).num_elts;
  }
  if (uVar11 != 0) {
    pFVar4 = (pFVar13->fadexpr_).right_;
    pFVar5 = (pFVar4->fadexpr_).right_;
    if ((pFVar5->dx_).num_elts != 0) {
      if (0 < (int)uVar2) {
        pdVar6 = (pFVar10->dx_).ptr_to_data;
        pdVar7 = (pFVar5->dx_).ptr_to_data;
        uVar12 = 0;
        do {
          dVar1 = (pFVar9->fadexpr_).left_.constant_;
          dVar15 = (pFVar4->fadexpr_).left_.constant_ - pFVar5->val_;
          pdVar8[uVar12] =
               (pdVar6[uVar12] * dVar1 * dVar15 + dVar1 * pFVar10->val_ * pdVar7[uVar12]) /
               (dVar15 * dVar15);
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      goto LAB_00e11ad4;
    }
  }
  if (0 < (int)uVar2) {
    uVar12 = 0;
    do {
      vVar14 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
               ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar12);
      pdVar8[uVar12] = vVar14;
      uVar12 = uVar12 + 1;
    } while (uVar2 != uVar12);
  }
LAB_00e11ad4:
  pFVar13 = (fadexpr->fadexpr_).left_;
  pFVar9 = (pFVar13->fadexpr_).left_;
  pFVar4 = (pFVar13->fadexpr_).right_;
  this->val_ = ((pFVar9->fadexpr_).left_.constant_ * ((pFVar9->fadexpr_).right_)->val_) /
               ((pFVar4->fadexpr_).left_.constant_ - ((pFVar4->fadexpr_).right_)->val_) -
               (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}